

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O3

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateE
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar23;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  double *pdVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  pointer pdVar42;
  pointer pdVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  
  dVar48 = dt * -12.56637061432;
  dVar47 = dt * 29979245800.0;
  dVar49 = dVar47 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar50 = dVar47 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar15 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar23 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  iVar1 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z;
  uVar33 = uVar15 - 1;
  uVar25 = (ulong)(uVar23 - 1);
  uVar26 = (ulong)(iVar1 - 1U);
  if (0 < (int)uVar33) {
    dVar47 = dVar47 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
    uVar24 = 0;
    do {
      if (1 < (int)uVar23) {
        iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.y;
        lVar40 = (long)(int)uVar24;
        iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.z;
        pdVar16 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
        lVar37 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
        iVar5 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y;
        iVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
        iVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.y;
        iVar8 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
        iVar9 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.y;
        iVar10 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
        lVar27 = (long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y * uVar24);
        lVar28 = (long)(int)(iVar4 * uVar24);
        pdVar17 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar29 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
        pdVar18 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar42 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.z;
        pdVar43 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar30 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
        pdVar20 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar12 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
        iVar13 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.z;
        pdVar21 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar14 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
        pdVar22 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar38 = 0;
        do {
          if (1 < iVar1) {
            lVar44 = (uVar38 + lVar28) * lVar37;
            lVar34 = (uVar38 + (long)(int)(iVar5 * uVar24)) * lVar29;
            lVar31 = (iVar6 * lVar40 + uVar38) * (long)iVar1;
            lVar45 = (uVar38 + lVar27) * lVar30;
            lVar32 = (uVar38 + (long)(int)(iVar8 * uVar24)) * (long)iVar12;
            lVar39 = (uVar38 + (long)(int)(uVar24 * iVar10)) * (long)iVar14;
            lVar41 = 0;
            do {
              *(double *)((long)pdVar19 + lVar41 + lVar31 * 8) =
                   (*(double *)((long)pdVar18 + lVar41 + lVar34 * 8 + 8) -
                   *(double *)((long)pdVar18 + lVar41 + lVar34 * 8)) * -dVar50 +
                   *(double *)((long)pdVar16 + lVar41 + (uVar38 + iVar2 * lVar40) * (long)iVar3 * 8)
                   * dVar48 +
                   (*(double *)((long)pdVar17 + lVar41 + (uVar38 + lVar28 + 1) * lVar37 * 8) -
                   *(double *)((long)pdVar17 + lVar41 + lVar44 * 8)) * dVar49 +
                   *(double *)((long)pdVar19 + lVar41 + lVar31 * 8);
              *(double *)((long)pdVar42 + lVar41 + lVar32 * 8) =
                   (*(double *)
                     ((long)pdVar17 +
                     lVar41 + ((long)(int)(iVar4 * (uVar24 + 1)) + uVar38) * lVar37 * 8) -
                   *(double *)((long)pdVar17 + lVar41 + lVar44 * 8)) * -dVar47 +
                   *(double *)
                    ((long)pdVar43 + lVar41 + (uVar38 + iVar7 * lVar40) * (long)iVar11 * 8) * dVar48
                   + (*(double *)((long)pdVar20 + lVar41 + lVar45 * 8 + 8) -
                     *(double *)((long)pdVar20 + lVar41 + lVar45 * 8)) * dVar50 +
                   *(double *)((long)pdVar42 + lVar41 + lVar32 * 8);
              *(double *)((long)pdVar22 + lVar41 + lVar39 * 8) =
                   (*(double *)((long)pdVar20 + lVar41 + (uVar38 + lVar27 + 1) * lVar30 * 8) -
                   *(double *)((long)pdVar20 + lVar41 + lVar45 * 8)) * -dVar49 +
                   *(double *)
                    ((long)pdVar21 +
                    lVar41 + (uVar38 + (long)(int)(iVar9 * uVar24)) * (long)iVar13 * 8) * dVar48 +
                   (*(double *)
                     ((long)pdVar18 +
                     lVar41 + (uVar38 + (long)(int)(iVar5 * (uVar24 + 1))) * lVar29 * 8) -
                   *(double *)((long)pdVar18 + lVar41 + lVar34 * 8)) * dVar47 +
                   *(double *)((long)pdVar22 + lVar41 + lVar39 * 8);
              lVar41 = lVar41 + 8;
            } while (uVar26 * 8 - lVar41 != 0);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar25);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar33);
    if (0 < (int)uVar33) {
      iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.y;
      lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).jzData.size.z;
      lVar29 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
      lVar37 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y;
      lVar30 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
      iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
      lVar40 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
      lVar28 = (long)(int)(iVar1 - 1U);
      pdVar16 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar17 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar18 = (grid->super_Grid<(pica::Dimension)3,_double>).jzData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar31 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y * lVar29 * 8;
      pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar38 = 0;
      do {
        if (1 < (int)uVar23) {
          pdVar46 = (double *)((long)pdVar18 + iVar2 * lVar27 * 8 * uVar38 + lVar28 * 8);
          pdVar36 = (double *)((long)pdVar19 + uVar38 * iVar3 * lVar40 * 8 + lVar28 * 8);
          uVar35 = uVar25;
          pdVar42 = pdVar17 + lVar28;
          pdVar43 = pdVar16 + lVar28;
          do {
            *pdVar36 = (*(double *)((long)pdVar42 + (uVar38 * lVar37 + 1) * lVar30 * 8) -
                       *(double *)((long)pdVar42 + lVar37 * lVar30 * 8 * uVar38)) * -dVar49 +
                       *pdVar46 * dVar48 +
                       (*(double *)((long)pdVar43 + lVar31 * (uVar38 + 1)) -
                       *(double *)((long)pdVar43 + lVar31 * uVar38)) * dVar47 + *pdVar36;
            pdVar46 = pdVar46 + lVar27;
            pdVar43 = pdVar43 + lVar29;
            pdVar42 = pdVar42 + lVar30;
            pdVar36 = pdVar36 + lVar40;
            uVar35 = uVar35 - 1;
          } while (uVar35 != 0);
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != uVar33);
      if (0 < (int)uVar33) {
        iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.y;
        iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.size.z;
        pdVar16 = (grid->super_Grid<(pica::Dimension)3,_double>).jyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y;
        iVar5 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
        pdVar17 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar18 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar28 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
        lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
        pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
        iVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
        lVar29 = (long)(int)(uVar23 - 1);
        uVar38 = 0;
        do {
          if (1 < iVar1) {
            lVar37 = (uVar38 * (long)iVar4 + lVar29) * (long)iVar5 * 8;
            lVar30 = (uVar38 * (long)iVar6 + lVar29) * (long)iVar7;
            uVar35 = 0;
            do {
              pdVar17[lVar30 + uVar35] =
                   (pdVar19[((uVar38 + 1) * lVar28 + lVar29) * lVar27 + uVar35] -
                   pdVar19[(uVar38 * lVar28 + lVar29) * lVar27 + uVar35]) * -dVar47 +
                   pdVar16[(uVar38 * (long)iVar2 + lVar29) * (long)iVar3 + uVar35] * dVar48 +
                   (*(double *)((long)pdVar18 + uVar35 * 8 + lVar37 + 8) -
                   *(double *)((long)pdVar18 + uVar35 * 8 + lVar37)) * dVar50 +
                   pdVar17[lVar30 + uVar35];
              uVar35 = uVar35 + 1;
            } while (uVar26 != uVar35);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar33);
      }
    }
  }
  if (1 < (int)uVar23) {
    iVar2 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.y;
    lVar27 = (long)(int)uVar33;
    iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.size.z;
    pdVar16 = (grid->super_Grid<(pica::Dimension)3,_double>).jxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    lVar28 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y * lVar27;
    lVar29 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
    pdVar17 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y;
    iVar5 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
    pdVar18 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar19 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
    uVar38 = 0;
    do {
      if (1 < iVar1) {
        lVar37 = (uVar38 + iVar4 * lVar27) * (long)iVar5 * 8;
        lVar30 = (uVar38 + iVar6 * lVar27) * (long)iVar1;
        uVar35 = 0;
        do {
          pdVar18[lVar30 + uVar35] =
               (*(double *)((long)pdVar19 + uVar35 * 8 + lVar37 + 8) -
               *(double *)((long)pdVar19 + uVar35 * 8 + lVar37)) * -dVar50 +
               pdVar16[(iVar2 * lVar27 + uVar38) * (long)iVar3 + uVar35] * dVar48 +
               (pdVar17[(uVar38 + lVar28 + 1) * lVar29 + uVar35] -
               pdVar17[(uVar38 + lVar28) * lVar29 + uVar35]) * dVar49 + pdVar18[lVar30 + uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar26 != uVar35);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar25);
  }
  return;
}

Assistant:

static void updateE(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        const ValueType coeffCurrent = -static_cast<ValueType>(4) * Constants<ValueType>::pi() * dt;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(0, 0, 0);
        const IndexType end = grid.getSize() - IndexType(1, 1, 1);
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.ex(i, j, k) += coeffCurrent * grid.jx(i, j, k) +
                coeff.y * (grid.bz(i, j + 1, k) - grid.bz(i, j, k)) -
                coeff.z * (grid.by(i, j, k + 1) - grid.by(i, j, k));
            grid.ey(i, j, k) += coeffCurrent * grid.jy(i, j, k) +
                coeff.z * (grid.bx(i, j, k + 1) - grid.bx(i, j, k)) -
                coeff.x * (grid.bz(i + 1, j, k) - grid.bz(i, j, k));
            grid.ez(i, j, k) += coeffCurrent * grid.jz(i, j, k) +
                coeff.x * (grid.by(i + 1, j, k) - grid.by(i, j, k)) -
                coeff.y * (grid.bx(i, j + 1, k) - grid.bx(i, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.ez(i, j, end.z) += coeffCurrent * grid.jz(i, j, end.z) +
                coeff.x * (grid.by(i + 1, j, end.z) - grid.by(i, j, end.z)) -
                coeff.y * (grid.bx(i, j + 1, end.z) - grid.bx(i, j, end.z));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.ey(i, end.y, k) += coeffCurrent * grid.jy(i, end.y, k) +
                coeff.z * (grid.bx(i, end.y, k + 1) - grid.bx(i, end.y, k)) -
                coeff.x * (grid.bz(i + 1, end.y, k) - grid.bz(i, end.y, k));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.ex(end.x, j, k) += coeffCurrent * grid.jx(end.x, j, k) +
                coeff.y * (grid.bz(end.x, j + 1, k) - grid.bz(end.x, j, k)) -
                coeff.z * (grid.by(end.x, j, k + 1) - grid.by(end.x, j, k));
    }